

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expr.h
# Opt level: O2

void __thiscall enact::ReferenceExpr::~ReferenceExpr(ReferenceExpr *this)

{
  (this->super_Expr)._vptr_Expr = (_func_int **)&PTR__ReferenceExpr_00124608;
  std::_Optional_payload_base<enact::Token>::_M_reset
            ((_Optional_payload_base<enact::Token> *)&this->region);
  std::_Optional_payload_base<enact::Token>::_M_reset
            ((_Optional_payload_base<enact::Token> *)&this->permission);
  std::__cxx11::string::~string((string *)&(this->oper).lexeme);
  std::unique_ptr<enact::Expr,_std::default_delete<enact::Expr>_>::~unique_ptr(&this->expr);
  return;
}

Assistant:

~ReferenceExpr() override = default;